

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_idwt53_h(opj_dwt_t *dwt,OPJ_INT32 *tiledp)

{
  int sn_00;
  int *piVar1;
  int len_00;
  OPJ_INT32 *in_odd;
  OPJ_INT32 *in_even;
  OPJ_INT32 *out;
  OPJ_INT32 len;
  OPJ_INT32 sn;
  OPJ_INT32 *tiledp_local;
  opj_dwt_t *dwt_local;
  
  sn_00 = dwt->sn;
  len_00 = sn_00 + dwt->dn;
  if (dwt->cas == 0) {
    if (1 < len_00) {
      opj_idwt53_h_cas0(dwt->mem,sn_00,len_00,tiledp);
    }
  }
  else if (len_00 == 1) {
    *tiledp = *tiledp / 2;
  }
  else if (len_00 == 2) {
    piVar1 = dwt->mem;
    piVar1[1] = *tiledp - (tiledp[sn_00] + 1 >> 1);
    *piVar1 = tiledp[sn_00] + piVar1[1];
    memcpy(tiledp,dwt->mem,8);
  }
  else if (2 < len_00) {
    opj_idwt53_h_cas1(dwt->mem,sn_00,len_00,tiledp);
  }
  return;
}

Assistant:

static void opj_idwt53_h(const opj_dwt_t *dwt,
                         OPJ_INT32* tiledp)
{
#ifdef STANDARD_SLOW_VERSION
    /* For documentation purpose */
    opj_dwt_interleave_h(dwt, tiledp);
    opj_dwt_decode_1(dwt);
    memcpy(tiledp, dwt->mem, (OPJ_UINT32)(dwt->sn + dwt->dn) * sizeof(OPJ_INT32));
#else
    const OPJ_INT32 sn = dwt->sn;
    const OPJ_INT32 len = sn + dwt->dn;
    if (dwt->cas == 0) { /* Left-most sample is on even coordinate */
        if (len > 1) {
            opj_idwt53_h_cas0(dwt->mem, sn, len, tiledp);
        } else {
            /* Unmodified value */
        }
    } else { /* Left-most sample is on odd coordinate */
        if (len == 1) {
            tiledp[0] /= 2;
        } else if (len == 2) {
            OPJ_INT32* out = dwt->mem;
            const OPJ_INT32* in_even = &tiledp[sn];
            const OPJ_INT32* in_odd = &tiledp[0];
            out[1] = in_odd[0] - ((in_even[0] + 1) >> 1);
            out[0] = in_even[0] + out[1];
            memcpy(tiledp, dwt->mem, (OPJ_UINT32)len * sizeof(OPJ_INT32));
        } else if (len > 2) {
            opj_idwt53_h_cas1(dwt->mem, sn, len, tiledp);
        }
    }
#endif
}